

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O3

void anon_unknown.dwarf_16b826::modifyType(bool modify_version)

{
  FILE *__stream;
  size_t sVar1;
  undefined8 *puVar2;
  IoExc *this;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000039;
  ulong uVar5;
  string attrib_name;
  fpos_t position;
  fpos_t verflag_pos;
  uint local_78;
  undefined4 local_74;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  fpos_t local_50;
  fpos_t local_40;
  
  local_74 = (undefined4)CONCAT71(in_register_00000039,modify_version);
  __stream = fopen((anonymous_namespace)::filename_abi_cxx11_,"r+b");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," simulating new part type ",0x1a);
  std::ostream::flush();
  iVar3 = 4;
  do {
    fgetc(__stream);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  fgetpos(__stream,&local_40);
  iVar3 = 4;
  do {
    fgetc(__stream);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  if (DAT_001eb890 != (anonymous_namespace)::headers) {
    uVar5 = 0;
    do {
      local_68 = 0;
      local_60 = 0;
      local_70 = &local_60;
      iVar3 = fgetc(__stream);
      if ((char)iVar3 == '\0') {
        local_78 = 1;
        iVar3 = 0xc;
      }
      else {
        uVar4 = 1;
        do {
          std::__cxx11::string::push_back((char)&local_70);
          iVar3 = fgetc(__stream);
          uVar4 = uVar4 + 1;
        } while ((char)iVar3 != '\0');
        do {
          local_78 = uVar4;
          iVar3 = fgetc(__stream);
          uVar4 = local_78;
        } while ((char)iVar3 != '\0');
        sVar1 = fread(&local_78,4,1,__stream);
        if (sVar1 != 1) {
          this = (IoExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::IoExc::IoExc(this,"unable to read length of attribute");
          __cxa_throw(this,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
        }
        if (Imf_3_4::GLOBAL_SYSTEM_LITTLE_ENDIAN == '\0') {
          local_78 = local_78 >> 0x18 | (local_78 & 0xff0000) >> 8 | (local_78 & 0xff00) << 8 |
                     local_78 << 0x18;
        }
        if ((char)local_74 == '\0') {
          iVar3 = std::__cxx11::string::compare((char *)&local_70);
          if (iVar3 != 0) goto LAB_00162c56;
          fgetpos(__stream,&local_50);
          fsetpos(__stream,&local_50);
          fputc(0x58,__stream);
          if (DAT_001eb890 - (anonymous_namespace)::headers == 0x38) {
            puVar2 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
            sVar1 = puVar2[1];
            if ((sVar1 != _DAT_001eb7f0) ||
               ((sVar1 != 0 &&
                (iVar3 = bcmp((void *)*puVar2,Imf_3_4::SCANLINEIMAGE_abi_cxx11_,sVar1), iVar3 != 0))
               )) {
              puVar2 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
              sVar1 = puVar2[1];
              if ((sVar1 != _DAT_001eb810) ||
                 ((sVar1 != 0 &&
                  (iVar3 = bcmp((void *)*puVar2,Imf_3_4::TILEDIMAGE_abi_cxx11_,sVar1), iVar3 != 0)))
                 ) goto LAB_00162d56;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr," flipping header ",0x11);
            fsetpos(__stream,&local_40);
            fputc(2,__stream);
            fputc(8,__stream);
          }
LAB_00162d56:
          fclose(__stream);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," modified ",10);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_70);
          if (iVar3 != 0) {
LAB_00162c56:
            iVar3 = 0;
            uVar4 = local_78;
            if (0 < (int)local_78) {
              do {
                fgetc(__stream);
                uVar4 = uVar4 - 1;
              } while (uVar4 != 0);
            }
            goto LAB_00162d7b;
          }
          fgetpos(__stream,&local_50);
          fsetpos(__stream,&local_50);
          fputc(0x58,__stream);
          fclose(__stream);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," modified ",10);
        }
        iVar3 = 1;
      }
LAB_00162d7b:
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
    } while ((iVar3 == 0) ||
            ((iVar3 == 0xc &&
             (uVar5 = uVar5 + 1,
             uVar5 < (ulong)((DAT_001eb890 - (anonymous_namespace)::headers >> 3) *
                            0x6db6db6db6db6db7)))));
  }
  return;
}

Assistant:

void
modifyType (bool modify_version)
{
    FILE* f = fopen (filename.c_str (), "r+b");

    cout << " simulating new part type ";
    cout.flush ();

    for (int i = 0; i < 4; i++)
    {
        fgetc (f); // magic number
    }
    fpos_t verflag_pos;
    fgetpos (f, &verflag_pos);
    for (int i = 0; i < 4; i++)
    {
        fgetc (f); // version
    }

    // skip over each header
    for (size_t i = 0; i < headers.size (); i++)
    {
        // read each attribute in header i
        while (1)
        {
            char a;
            int  length = 0;

            std::string attrib_name;
            //name
            do
            {
                a = fgetc (f);
                if (a != '\0') attrib_name += a;
                length++;
            } while (a != '\0');

            // check for end-of-header byte
            if (length == 1) break;

            //type of attribute
            do
            {
                a = fgetc (f);

            } while (a != '\0');

            //length of attribute
            size_t nr = fread (&length, 4, 1, f);
            if (nr != 1)
                throw IEX_NAMESPACE::IoExc (
                    "unable to read length of attribute");
            if (!GLOBAL_SYSTEM_LITTLE_ENDIAN) { length = bswap_32 (length); }

            if (!modify_version && attrib_name == "type")
            {
                // modify the type of part 1 to be 'X<whatevever>'
                fpos_t position;
                fgetpos (f, &position);
                fsetpos (f, &position);
                char x = 'X';
                fwrite (&x, 1, 1, f);

                // need to set the 'not just an image' byte for single part regular image files
                // and clear the tiled bit
                if (headers.size () == 1 &&
                    (headers[0].type () == SCANLINEIMAGE ||
                     headers[0].type () == TILEDIMAGE))
                {
                    cerr << " flipping header ";

                    fsetpos (f, &verflag_pos);
                    char x = 2;
                    char y = 8;
                    fwrite (&x, 1, 1, f);
                    fwrite (&y, 1, 1, f);
                }
                fclose (f);

                cerr << " modified ";
                return;
            }

            if (modify_version && attrib_name == "version")
            {
                fpos_t position;
                fgetpos (f, &position);
                fsetpos (f, &position);
                char x = 'X';
                fwrite (&x, 1, 1, f);
                fclose (f);
                cerr << " modified ";
                return;
            }

            //value of attribute
            for (int i = 0; i < length; i++)
            {
                fgetc (f);
            }
        }
    }
}